

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

void __thiscall QMdi::ControlLabel::updateWindowIcon(ControlLabel *this)

{
  double dVar1;
  QSize QVar2;
  QSize QVar3;
  undefined8 uVar4;
  undefined1 auVar5 [8];
  undefined1 auVar6 [8];
  char cVar7;
  QStyle *pQVar8;
  long in_FS_OFFSET;
  QIcon menuIcon;
  undefined4 local_70;
  undefined4 local_6c;
  QSize local_68 [2];
  undefined8 local_58;
  undefined1 local_50 [8];
  QSize local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  QWidgetData *local_30;
  
  local_30 = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  local_50 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  QWidget::windowIcon((QWidget *)local_50);
  cVar7 = QIcon::isNull();
  if (cVar7 != '\0') {
    pQVar8 = QWidget::style(&this->super_QWidget);
    (**(code **)(*(long *)pQVar8 + 0x100))
              (local_68,pQVar8,0,0,*(undefined8 *)(*(long *)&(this->super_QWidget).field_0x8 + 0x10)
              );
    auVar5 = local_50;
    QVar2 = local_68[0];
    local_68[0].wd.m_i = 0;
    local_68[0].ht.m_i = 0;
    QVar3 = local_68[0];
    local_68[0].wd = QVar2.wd.m_i;
    local_68[0].ht = QVar2.ht.m_i;
    local_50._0_4_ = local_68[0].wd.m_i;
    local_50._4_4_ = local_68[0].ht.m_i;
    auVar6 = local_50;
    local_50._0_4_ = auVar5._0_4_;
    local_50._4_4_ = auVar5._4_4_;
    local_48.wd.m_i = local_50._0_4_;
    local_48.ht.m_i = local_50._4_4_;
    local_68[0] = QVar3;
    local_50 = auVar6;
    QIcon::~QIcon((QIcon *)&local_48);
    QIcon::~QIcon((QIcon *)local_68);
  }
  pQVar8 = QWidget::style(&this->super_QWidget);
  local_70 = (**(code **)(*(long *)pQVar8 + 0xe0))
                       (pQVar8,0x5b,0,
                        *(undefined8 *)(*(long *)&(this->super_QWidget).field_0x8 + 0x10));
  local_6c = local_70;
  dVar1 = (double)QPaintDevice::devicePixelRatio();
  QIcon::pixmap(local_68,dVar1,(Mode)(QIcon *)local_50,(State)&local_70);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QPaintDevice::QPaintDevice((QPaintDevice *)&local_48);
  uVar4 = local_58;
  local_48 = (QSize)QDataStream::operator<<;
  local_58 = 0;
  local_38 = *(undefined1 **)&this->field_0x38;
  *(undefined8 *)&this->field_0x38 = uVar4;
  QPixmap::~QPixmap((QPixmap *)&local_48);
  QPixmap::~QPixmap((QPixmap *)local_68);
  QWidget::update(&this->super_QWidget);
  QIcon::~QIcon((QIcon *)local_50);
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ControlLabel::updateWindowIcon()
{
    QIcon menuIcon = windowIcon();
    if (menuIcon.isNull())
        menuIcon = style()->standardIcon(QStyle::SP_TitleBarMenuButton, nullptr, parentWidget());
    const int iconSize = style()->pixelMetric(QStyle::PM_TitleBarButtonIconSize, nullptr, parentWidget());
    label = menuIcon.pixmap(QSize(iconSize, iconSize), devicePixelRatio());
    update();
}